

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v8::detail::format_value<char,my_type>(buffer<char> *buf,my_type *value,locale_ref loc)

{
  bool bVar1;
  _Ios_Iostate _Var2;
  buffer<char> *in_RDI;
  basic_ostream<char,_std::char_traits<char>_> output;
  formatbuf<char> format_buf;
  buffer<char> *in_stack_fffffffffffffe48;
  _Ios_Iostate _Var3;
  formatbuf<char> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  buffer<char> *in_stack_fffffffffffffe60;
  locale local_190 [8];
  locale local_188 [24];
  buffer<char> local_170 [8];
  streambuf local_60 [80];
  buffer<char> *local_10;
  locale_ref local_8;
  
  local_10 = in_RDI;
  formatbuf<char>::formatbuf(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::ostream::ostream((ostream *)local_170,local_60);
  bVar1 = locale_ref::operator_cast_to_bool(&local_8);
  if (bVar1) {
    in_stack_fffffffffffffe60 =
         (buffer<char> *)(local_170[0]._vptr_buffer[-3] + (long)&local_170[0]._vptr_buffer);
    locale_ref::get<std::locale>
              ((locale_ref *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::ios::imbue(local_188);
    std::locale::~locale(local_188);
    std::locale::~locale(local_190);
  }
  operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe50,
             (my_type *)in_stack_fffffffffffffe48);
  _Var3 = (int)local_170 + (int)local_170[0]._vptr_buffer[-3];
  _Var2 = std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions(_Var3);
  buffer<char>::size(local_10);
  buffer<char>::try_resize(in_stack_fffffffffffffe60,CONCAT44(_Var2,in_stack_fffffffffffffe58));
  std::ostream::~ostream((ostream *)local_170);
  formatbuf<char>::~formatbuf((formatbuf<char> *)0x155008);
  return;
}

Assistant:

void format_value(buffer<Char>& buf, const T& value,
                  locale_ref loc = locale_ref()) {
  formatbuf<Char> format_buf(buf);
  std::basic_ostream<Char> output(&format_buf);
#if !defined(FMT_STATIC_THOUSANDS_SEPARATOR)
  if (loc) output.imbue(loc.get<std::locale>());
#endif
  output << value;
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  buf.try_resize(buf.size());
}